

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.h
# Opt level: O2

void llvm::yaml::ScalarEnumerationTraits<llvm::dwarf::UnitType,_void>::enumeration
               (IO *io,UnitType *value)

{
  IO::enumCase<llvm::dwarf::UnitType>(io,value,"DW_UT_compile",DW_UT_compile);
  IO::enumCase<llvm::dwarf::UnitType>(io,value,"DW_UT_type",DW_UT_type);
  IO::enumCase<llvm::dwarf::UnitType>(io,value,"DW_UT_partial",DW_UT_partial);
  IO::enumCase<llvm::dwarf::UnitType>(io,value,"DW_UT_skeleton",DW_UT_skeleton);
  IO::enumCase<llvm::dwarf::UnitType>(io,value,"DW_UT_split_compile",DW_UT_split_compile);
  IO::enumCase<llvm::dwarf::UnitType>(io,value,"DW_UT_split_type",DW_UT_split_type);
  IO::enumFallback<llvm::yaml::Hex8,llvm::dwarf::UnitType>(io,value);
  return;
}

Assistant:

static void enumeration(IO &io, dwarf::UnitType &value) {
#include "llvm/BinaryFormat/Dwarf.def"
    io.enumFallback<Hex8>(value);
  }